

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O0

deBool deStringBeginsWith(char *str,char *lead)

{
  char cVar1;
  char cVar2;
  char *local_30;
  char *b;
  char *a;
  char *lead_local;
  char *str_local;
  
  local_30 = lead;
  b = str;
  do {
    if (*local_30 == '\0') {
      return 1;
    }
    cVar1 = *b;
    cVar2 = *local_30;
    local_30 = local_30 + 1;
    b = b + 1;
  } while (cVar1 == cVar2);
  return 0;
}

Assistant:

deBool deStringBeginsWith (const char* str, const char* lead)
{
	const char* a = str;
	const char* b = lead;

	while (*b)
	{
		if (*a++ != *b++)
			return DE_FALSE;
	}

	return DE_TRUE;
}